

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void stone_close_handler(CManager_conflict cm,CMConnection conn,void *client_data)

{
  FILE *pFVar1;
  _proto_action *p_Var2;
  int iVar3;
  __pid_t _Var4;
  stone_type p_Var5;
  pthread_t pVar6;
  long lVar7;
  event_path_data evp;
  long lVar8;
  timespec ts;
  EVStoneCloseHandlerFunc local_60;
  timespec local_58;
  void *local_48;
  event_path_data local_40;
  FILE *local_38;
  
  evp = cm->evp;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                   ,0x807);
  p_Var5 = stone_struct(evp,(int)client_data);
  if (p_Var5 == (stone_type)0x0) {
    iVar3 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(cm,EVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var4 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_58);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,
              "Got a close for connection %p on already free\'d stone %x, shutting down\n",conn,
              (ulong)client_data & 0xffffffff);
    }
    fflush((FILE *)cm->CMTrace_file);
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                       ,0x80c);
  }
  else {
    iVar3 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar3 = CMtrace_init(cm,EVerbose);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var4 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var4,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_58);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Got a close for connection %p on stone %x, shutting down\n",
              conn,(ulong)client_data & 0xffffffff);
    }
    local_48 = client_data;
    fflush((FILE *)cm->CMTrace_file);
    if (p_Var5->proto_action_count < 1) {
      local_60 = (EVStoneCloseHandlerFunc)0x0;
    }
    else {
      lVar8 = 0;
      lVar7 = 0;
      local_60 = (EVStoneCloseHandlerFunc)0x0;
      local_40 = evp;
      do {
        p_Var2 = p_Var5->proto_actions;
        if ((*(int *)((long)&p_Var2->action_type + lVar8) == 1) &&
           (*(CMConnection *)((long)&p_Var2->o + lVar8) == conn)) {
          *(undefined4 *)((long)&p_Var2->o + lVar8 + 0x18) = 1;
          *(undefined8 *)((long)&p_Var2->o + lVar8) = 0;
          iVar3 = CMtrace_val[7];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar3 = CMtrace_init(cm,CMFreeVerbose);
          }
          if (iVar3 != 0) {
            if (CMtrace_PID != 0) {
              local_38 = (FILE *)cm->CMTrace_file;
              _Var4 = getpid();
              pVar6 = pthread_self();
              evp = local_40;
              fprintf(local_38,"P%lxT%lx - ",(long)_Var4,pVar6);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_58);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
            }
            fprintf((FILE *)cm->CMTrace_file,"Closing and dereferencing conn %p\n",conn);
          }
          fflush((FILE *)cm->CMTrace_file);
          INT_CMConnection_close(conn);
          if (evp->app_stone_close_handler != (EVStoneCloseHandlerFunc)0x0) {
            local_60 = evp->app_stone_close_handler;
          }
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 0x60;
      } while (lVar7 < p_Var5->proto_action_count);
    }
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                       ,0x823);
    if (local_60 != (EVStoneCloseHandlerFunc)0x0) {
      (*local_60)(cm,conn,(int)local_48,evp->app_stone_close_data);
    }
  }
  return;
}

Assistant:

static void
stone_close_handler(CManager cm, CMConnection conn, void *client_data)
{
    event_path_data evp = cm->evp;
    int s = (int)(intptr_t)client_data;  /* stone ID */
    int a = 0;
    stone_type stone;
    EVStoneCloseHandlerFunc handler = NULL;
    CManager_lock(cm);
    stone = stone_struct(evp, s);
    if (!stone) {
	CMtrace_out(cm, EVerbose, "Got a close for connection %p on already free'd stone %x, shutting down\n",
		    conn, s);
	CManager_unlock(cm);
	return;
    }
    CMtrace_out(cm, EVerbose, "Got a close for connection %p on stone %x, shutting down\n",
		conn, s);
    for (a=0 ; a < stone->proto_action_count; a++) {
	proto_action *act = &stone->proto_actions[a];
	if ((act->action_type == Action_Bridge) && 
	    (act->o.bri.conn == conn)) {
	    act->o.bri.conn_failed = 1;
	    act->o.bri.conn = NULL;
	    CMtrace_out(cm, CMFreeVerbose, "Closing and dereferencing conn %p\n", conn);
	    INT_CMConnection_close(conn);   /* dereference the connection */
/*	    while (act->queue->queue_head != NULL) {
		int action_id;
		event_item *event = dequeue_event(cm, act->queue, &action_id);
		return_event(evp, event);
		}*/
	    if (evp->app_stone_close_handler) {
	        handler = evp->app_stone_close_handler;
	    }
	}
    }
    CManager_unlock(cm);
    if (handler) handler(cm, conn, s, evp->app_stone_close_data);
}